

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

bool glu::sl::isValid(ValueBlock *block)

{
  VarType *this;
  long lVar1;
  VarType *pVVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *format;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  
  bVar12 = false;
  uVar7 = 0;
  do {
    lVar11 = 0x30;
    if (uVar7 == 1) {
      lVar11 = 0x18;
    }
    if (uVar7 == 0) {
      lVar11 = 0;
    }
    this = *(VarType **)
            ((long)&(block->inputs).
                    super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar11);
    if (this != *(VarType **)
                 ((long)&(block->inputs).
                         super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl
                         .super__Vector_impl_data._M_finish + lVar11)) {
      lVar1 = *(long *)((long)&this[2].m_data + 8);
      pVVar2 = this[2].m_data.array.elementType;
      iVar5 = VarType::getScalarSize(this);
      lVar9 = *(long *)((long)&(block->inputs).
                               super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar11);
      if (*(long *)((long)&(block->inputs).
                           super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                           _M_impl.super__Vector_impl_data._M_finish + lVar11) != lVar9) {
        lVar8 = 0;
        uVar10 = 0;
        do {
          if (*(int *)(lVar9 + lVar8) != 0) {
            format = "ERROR: Value \'%s\' is of unsupported type!\n";
LAB_00a05ea6:
            tcu::print(format,*(undefined8 *)(lVar9 + 0x18 + lVar8));
            return bVar12;
          }
          lVar3 = *(long *)(lVar9 + 0x40 + lVar8);
          lVar4 = *(long *)(lVar9 + 0x38 + lVar8);
          iVar6 = VarType::getScalarSize((VarType *)(lVar8 + lVar9));
          if (lVar3 - lVar4 >> 2 !=
              (long)iVar6 * ((ulong)(lVar1 - (long)pVVar2 >> 2) / (ulong)(long)iVar5)) {
            format = "ERROR: Value \'%s\' has invalid number of scalars!\n";
            goto LAB_00a05ea6;
          }
          uVar10 = uVar10 + 1;
          lVar9 = *(long *)((long)&(block->inputs).
                                   super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar11);
          lVar8 = lVar8 + 0x50;
        } while (uVar10 < (ulong)((*(long *)((long)&(block->inputs).
                                                                                                        
                                                  super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                            lVar11) - lVar9 >> 4) * -0x3333333333333333));
      }
    }
    bVar12 = 1 < uVar7;
    uVar7 = uVar7 + 1;
    if (uVar7 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool isValid (const ValueBlock& block)
{
	for (size_t storageNdx = 0; storageNdx < 3; ++storageNdx)
	{
		const vector<Value>&	values		= storageNdx == 0 ? block.inputs	:
											  storageNdx == 1 ? block.outputs	:
																block.uniforms;
		const size_t			refArrayLen	= values.empty() ? 0 : (values[0].elements.size() / (size_t)values[0].type.getScalarSize());

		for (size_t valNdx = 0; valNdx < values.size(); ++valNdx)
		{
			const Value&	value	= values[valNdx];

			if (!value.type.isBasicType())
			{
				print("ERROR: Value '%s' is of unsupported type!\n", value.name.c_str());
				return false;
			}

			if (value.elements.size() != refArrayLen*(size_t)value.type.getScalarSize())
			{
				print("ERROR: Value '%s' has invalid number of scalars!\n", value.name.c_str());
				return false;
			}
		}
	}

	return true;
}